

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O3

void utest_register_shader_parser_parse_0(void)

{
  size_t sVar1;
  char *pcVar2;
  utest_test_state_s *puVar3;
  
  sVar1 = utest_state.tests_length;
  utest_state.tests_length = utest_state.tests_length + 1;
  pcVar2 = (char *)malloc(0x16);
  puVar3 = (utest_test_state_s *)realloc(utest_state.tests,sVar1 * 0x18 + 0x18);
  utest_state.tests = puVar3;
  puVar3[sVar1].func = utest_shader_parser_parse_0;
  puVar3[sVar1].name = pcVar2;
  builtin_strncpy(pcVar2,"shader_parser.parse_0",0x16);
  return;
}

Assistant:

UTEST(shader_parser, parse_0) {
    std::vector<std::string> watches;
    std::vector<RenderPass> render_passes;
    std::vector<GUIComponent> components;
    std::string error;

    T(ShaderParserParse("tests", "tests/shader0.frag", watches, render_passes, components, error));

    T(error.empty());
    T(render_passes.size() == 3);

    T(!render_passes[0].IsMain);
    T(render_passes[0].Input.empty());
    T(render_passes[0].Output == "pass0");
    T(render_passes[0].Height == 256);
    T(render_passes[0].Width == 256);
    T(!render_passes[0].ShaderSource.empty());
    T(!render_passes[0].Textures.empty());
    T(render_passes[0].Textures[0].Width == 1653);
    T(render_passes[0].Textures[0].Height == 1252)
    T(render_passes[0].Textures[0].Data);

    T(!render_passes[1].IsMain);
    T(render_passes[1].Input == "pass0");
    T(render_passes[1].Output == "pass1");
    T(render_passes[1].Height == 512);
    T(render_passes[1].Width == 512);
    T(!render_passes[1].ShaderSource.empty());
    T(render_passes[1].Textures.empty());

    T(render_passes[2].Input == "pass1");
    T(render_passes[2].Output == "main");
    T(render_passes[2].IsMain);
    T(!render_passes[2].ShaderSource.empty());
    T(!render_passes[2].Textures.empty());
    T(render_passes[2].Textures[0].Width == 2320);
    T(render_passes[2].Textures[0].Height == 1485)
    T(render_passes[2].Textures[0].Data);
}